

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.hpp
# Opt level: O0

shared_ptr<helics::CommFactory::CommBuilder>
helics::CommFactory::addCommType<helics::zeromq::ZmqComms>(string_view commTypeName,int code)

{
  string_view name;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<helics::CommFactory::CommBuilder> *in_RDI;
  shared_ptr<helics::CommFactory::CommBuilder> sVar1;
  shared_ptr<helics::CommFactory::CommTypeBuilder<helics::zeromq::ZmqComms>_> bld;
  shared_ptr<helics::CommFactory::CommBuilder> *cbld;
  shared_ptr<helics::CommFactory::CommBuilder> *this;
  shared_ptr<helics::CommFactory::CommBuilder> *__r;
  int in_stack_ffffffffffffffbc;
  shared_ptr<helics::CommFactory::CommBuilder> *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 uVar2;
  element_type *in_stack_ffffffffffffffd0;
  
  this = (shared_ptr<helics::CommFactory::CommBuilder> *)&stack0xffffffffffffffd0;
  __r = in_RDI;
  std::make_shared<helics::CommFactory::CommTypeBuilder<helics::zeromq::ZmqComms>>();
  uVar2 = 0;
  std::
  static_pointer_cast<helics::CommFactory::CommBuilder,helics::CommFactory::CommTypeBuilder<helics::zeromq::ZmqComms>>
            ((shared_ptr<helics::CommFactory::CommTypeBuilder<helics::zeromq::ZmqComms>_> *)__r);
  std::shared_ptr<helics::CommFactory::CommBuilder>::shared_ptr(this,in_RDI);
  name._M_len._7_1_ = uVar2;
  name._M_len._0_7_ = in_stack_ffffffffffffffc8;
  name._M_str = (char *)in_stack_ffffffffffffffd0;
  defineCommBuilder(in_stack_ffffffffffffffc0,name,in_stack_ffffffffffffffbc);
  std::shared_ptr<helics::CommFactory::CommBuilder>::~shared_ptr
            ((shared_ptr<helics::CommFactory::CommBuilder> *)0x37c9be);
  std::shared_ptr<helics::CommFactory::CommTypeBuilder<helics::zeromq::ZmqComms>_>::~shared_ptr
            ((shared_ptr<helics::CommFactory::CommTypeBuilder<helics::zeromq::ZmqComms>_> *)0x37ca0e
            );
  sVar1.super___shared_ptr<helics::CommFactory::CommBuilder,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<helics::CommFactory::CommBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<helics::CommFactory::CommBuilder>)
         sVar1.super___shared_ptr<helics::CommFactory::CommBuilder,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CommBuilder> addCommType(std::string_view commTypeName, int code)
    {
        auto bld = std::make_shared<CommTypeBuilder<CommTYPE>>();
        std::shared_ptr<CommBuilder> cbld = std::static_pointer_cast<CommBuilder>(bld);
        defineCommBuilder(cbld, commTypeName, code);
        return cbld;
    }